

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::DirectStateAccess::Textures::BufferRangeErrorsTest::iterate(BufferRangeErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  ContextType ctxType;
  deUint32 dVar9;
  undefined4 extraout_var;
  char *description;
  byte bVar11;
  GLuint not_a_texture;
  uint uVar12;
  qpTestResult testResult;
  ErrorsUtilities *pEVar13;
  TestContext *this_00;
  GLuint not_a_buffer;
  GLuint buffer;
  GLuint texture_buffer;
  GLuint texture_1D;
  GLint gl_texture_buffer_offset_alignment;
  int local_44;
  uint local_40;
  byte local_3a;
  byte local_39;
  uint local_38;
  int local_34;
  long lVar10;
  
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar8);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar1) || (bVar2)) {
    local_40 = 0;
    local_38 = 0;
    local_44 = 0;
    (**(code **)(lVar10 + 0x400))(0x8c2a,1);
    dVar9 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar9,"glCreateTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x200b);
    (**(code **)(lVar10 + 0x400))(0xde0,1,&local_38);
    dVar9 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar9,"glCreateTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x200e);
    (**(code **)(lVar10 + 0x3b8))(1,&local_44);
    dVar9 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar9,"glCreateBuffers has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x2011);
    (**(code **)(lVar10 + 0xec0))(local_44,4,"\x01\x02\x03\x04",0x88e6);
    dVar9 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar9,"glNamedBufferData has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x2014);
    uVar12 = 0;
    do {
      uVar12 = uVar12 + 1;
      cVar3 = (**(code **)(lVar10 + 0xcc8))(uVar12);
    } while (cVar3 != '\0');
    dVar9 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar9,"glIsTexture has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x201d);
    pEVar13 = (ErrorsUtilities *)(ulong)uVar12;
    (**(code **)(lVar10 + 0x13e0))(pEVar13,0x8058,local_44,0,4);
    bVar1 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar13,(this->super_TestCase).m_context,0x502,"glTextureBufferRange",
                       "texture is not the name of an existing texture object.");
    pEVar13 = (ErrorsUtilities *)(ulong)local_38;
    (**(code **)(lVar10 + 0x13e0))(pEVar13,0x8058,local_44,0,4);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar13,(this->super_TestCase).m_context,0x500,"glTextureBufferRange",
                       "the effective target of texture is not TEXTURE_BUFFER.");
    pEVar13 = (ErrorsUtilities *)(ulong)local_40;
    (**(code **)(lVar10 + 0x13e0))(pEVar13,0x8dbc,local_44,0,4);
    bVar4 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar13,(this->super_TestCase).m_context,0x500,"glTextureBufferRange",
                       "internalformat is not one of the supported sized internal formats.");
    iVar8 = 0;
    do {
      iVar8 = iVar8 + 1;
      cVar3 = (**(code **)(lVar10 + 0xc68))(iVar8);
    } while (cVar3 != '\0');
    dVar9 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar9,"glIsBuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x203e);
    pEVar13 = (ErrorsUtilities *)(ulong)local_40;
    (**(code **)(lVar10 + 0x13e0))(pEVar13,0x8058,iVar8,0,4);
    local_39 = ErrorsUtilities::CheckErrorAndLog
                         (pEVar13,(this->super_TestCase).m_context,0x502,"glTextureBufferRange",
                          "buffer is not zero and is not the name of an existing buffer object.");
    pEVar13 = (ErrorsUtilities *)(ulong)local_40;
    (**(code **)(lVar10 + 0x13e0))(pEVar13,0x8058,local_44,0xffffffffffffffff,4);
    local_3a = ErrorsUtilities::CheckErrorAndLog
                         (pEVar13,(this->super_TestCase).m_context,0x501,"glTextureBufferRange",
                          "offset is negative.");
    pEVar13 = (ErrorsUtilities *)(ulong)local_40;
    (**(code **)(lVar10 + 0x13e0))(pEVar13,0x8058,local_44,0,0);
    bVar5 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar13,(this->super_TestCase).m_context,0x501,"glTextureBufferRange",
                       "size is zero.");
    pEVar13 = (ErrorsUtilities *)(ulong)local_40;
    (**(code **)(lVar10 + 0x13e0))(pEVar13,0x8058,local_44,0,0xffffffffffffffff);
    bVar6 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar13,(this->super_TestCase).m_context,0x501,"glTextureBufferRange",
                       "size is negative.");
    pEVar13 = (ErrorsUtilities *)(ulong)local_40;
    (**(code **)(lVar10 + 0x13e0))(pEVar13,0x8058,local_44,0,0x40);
    bVar7 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar13,(this->super_TestCase).m_context,0x501,"glTextureBufferRange",
                       "size is greater than the value of BUFFER_SIZE for buffer.");
    local_34 = 0;
    (**(code **)(lVar10 + 0x868))(0x919f);
    bVar11 = ((bVar1 && bVar2) && bVar4) & local_39 & local_3a & bVar5 & bVar6 & bVar7;
    if (1 < local_34) {
      pEVar13 = (ErrorsUtilities *)(ulong)local_40;
      (**(code **)(lVar10 + 0x13e0))(pEVar13,0x8058,local_44,1,3);
      bVar1 = ErrorsUtilities::CheckErrorAndLog
                        (pEVar13,(this->super_TestCase).m_context,0x501,"glTextureBufferRange",
                         "offset is not an integer multiple of the value of TEXTURE_BUFFER_OFFSET_ALIGNMENT."
                        );
      bVar11 = bVar11 & bVar1;
    }
    if (local_38 != 0) {
      (**(code **)(lVar10 + 0x480))(1);
    }
    if (local_40 != 0) {
      (**(code **)(lVar10 + 0x480))(1);
    }
    if (local_44 != 0) {
      (**(code **)(lVar10 + 0x438))(1);
    }
    do {
      iVar8 = (**(code **)(lVar10 + 0x800))();
    } while (iVar8 != 0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar11 == 0) {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
    else {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult BufferRangeErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Textures' objects */
	glw::GLuint texture_buffer = 0;
	glw::GLuint texture_1D	 = 0;
	glw::GLuint buffer		   = 0;

	static const glw::GLubyte data[4]   = { 1, 2, 3, 4 };
	static const glw::GLuint  data_size = sizeof(data);

	try
	{
		/* Auxiliary objects setup. */
		gl.createTextures(GL_TEXTURE_BUFFER, 1, &texture_buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTextures has failed");

		gl.createTextures(GL_TEXTURE_1D, 1, &texture_1D);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTextures has failed");

		gl.createBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers has failed");

		gl.namedBufferData(buffer, data_size, data, GL_STATIC_COPY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBufferData has failed");

		/*  Check that INVALID_OPERATION is generated by TextureBufferRange if
		 texture is not the name of an existing texture object.*/
		{
			glw::GLuint not_a_texture = 0;

			while (gl.isTexture(++not_a_texture))
				;
			GLU_EXPECT_NO_ERROR(gl.getError(), "glIsTexture has failed");

			gl.textureBufferRange(not_a_texture, GL_RGBA8, buffer, 0, data_size);

			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureBufferRange",
									  "texture is not the name of an existing texture object.");
		}

		/*  Check that INVALID_ENUM is generated by TextureBufferRange if the
		 effective target of texture is not TEXTURE_BUFFER. */
		{
			gl.textureBufferRange(texture_1D, GL_RGBA8, buffer, 0, data_size);

			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureBufferRange",
									  "the effective target of texture is not TEXTURE_BUFFER.");
		}

		/*  Check that INVALID_ENUM is generated by TextureBufferRange if
		 internalformat is not one of the sized internal formats described above. */
		{
			gl.textureBufferRange(texture_buffer, GL_COMPRESSED_SIGNED_RED_RGTC1, buffer, 0, data_size);

			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureBufferRange",
									  "internalformat is not one of the supported sized internal formats.");
		}

		/*  Check that INVALID_OPERATION is generated by TextureBufferRange if
		 buffer is not zero and is not the name of an existing buffer object. */
		{
			glw::GLuint not_a_buffer = 0;

			while (gl.isBuffer(++not_a_buffer))
				;
			GLU_EXPECT_NO_ERROR(gl.getError(), "glIsBuffer has failed");

			gl.textureBufferRange(texture_buffer, GL_RGBA8, not_a_buffer, 0, data_size);

			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureBufferRange",
									  "buffer is not zero and is not the name of an existing buffer object.");
		}

		/* Check that INVALID_VALUE is generated by TextureBufferRange if offset
		 is negative, if size is less than or equal to zero, or if offset + size
		 is greater than the value of BUFFER_SIZE for buffer. */
		{
			gl.textureBufferRange(texture_buffer, GL_RGBA8, buffer, -1, data_size);

			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureBufferRange", "offset is negative.");

			gl.textureBufferRange(texture_buffer, GL_RGBA8, buffer, 0, 0);

			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureBufferRange", "size is zero.");

			gl.textureBufferRange(texture_buffer, GL_RGBA8, buffer, 0, -1);

			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureBufferRange", "size is negative.");

			gl.textureBufferRange(texture_buffer, GL_RGBA8, buffer, 0, data_size * 16);

			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureBufferRange",
									  "size is greater than the value of BUFFER_SIZE for buffer.");
		}

		/* Check that INVALID_VALUE is generated by TextureBufferRange if offset is
		 not an integer multiple of the value of TEXTURE_BUFFER_OFFSET_ALIGNMENT. */
		{
			glw::GLint gl_texture_buffer_offset_alignment = 0;

			gl.getIntegerv(GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT, &gl_texture_buffer_offset_alignment);

			/* If alignmet is 1 we cannot do anything. Error situtation is impossible then. */
			if (gl_texture_buffer_offset_alignment > 1)
			{
				gl.textureBufferRange(texture_buffer, GL_RGBA8, buffer, 1, data_size - 1);

				is_ok &= CheckErrorAndLog(
					m_context, GL_INVALID_VALUE, "glTextureBufferRange",
					"offset is not an integer multiple of the value of TEXTURE_BUFFER_OFFSET_ALIGNMENT.");
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	if (texture_1D)
	{
		gl.deleteTextures(1, &texture_1D);
	}

	if (texture_buffer)
	{
		gl.deleteTextures(1, &texture_buffer);
	}

	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}